

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Mix_Generic_SSE2
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  long in_R8;
  long in_R9;
  __m128 v;
  __m128 dat;
  __m128 vols;
  uint32_t ci;
  uint32_t co;
  uint32_t i;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_28;
  undefined4 uStack_24;
  float fVar3;
  
  local_58 = in_R8;
  local_50 = in_RCX;
  for (local_64 = 0; local_64 < in_EDI; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < in_EDX; local_68 = local_68 + 1) {
      for (local_6c = 0; 3 < in_ESI - local_6c; local_6c = local_6c + 4) {
        uVar1 = *(undefined8 *)(in_R9 + (ulong)(local_68 * in_ESI + local_6c) * 4);
        uVar2 = *(undefined8 *)(local_50 + (ulong)local_6c * 4);
        local_28 = (float)uVar2;
        uStack_24 = (float)((ulong)uVar2 >> 0x20);
        local_38 = (float)uVar1;
        uStack_34 = (float)((ulong)uVar1 >> 0x20);
        v[0] = local_28 * local_38;
        v[1] = uStack_24 * uStack_34;
        v[2] = (float)(int)uVar2;
        v[3] = (float)(int)((ulong)uVar2 >> 0x20);
        fVar3 = FAudio_simd_hadd(v);
        *(float *)(local_58 + (ulong)local_68 * 4) =
             fVar3 + *(float *)(local_58 + (ulong)local_68 * 4);
      }
      for (; local_6c < in_ESI; local_6c = local_6c + 1) {
        *(float *)(local_58 + (ulong)local_68 * 4) =
             *(float *)(local_50 + (ulong)local_6c * 4) *
             *(float *)(in_R9 + (ulong)(local_68 * in_ESI + local_6c) * 4) +
             *(float *)(local_58 + (ulong)local_68 * 4);
      }
    }
    local_50 = local_50 + (ulong)in_ESI * 4;
    local_58 = local_58 + (ulong)in_EDX * 4;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_SSE2(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; srcChans - ci >= 4; ci += 4)
		{
			/* do SIMD */
			const __m128 vols = _mm_loadu_ps(&coefficients[co * srcChans + ci]);
			const __m128 dat = _mm_loadu_ps(&src[ci]);
			dst[co] += FAudio_simd_hadd(_mm_mul_ps(dat, vols));
		}

		for (; ci < srcChans; ci += 1)
		{
			/* do scalar */
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}